

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmGeneratedFileStream *pcVar2;
  cmMakefile *this_00;
  cmGlobalUnixMakefileGenerator3 *pcVar3;
  pointer pbVar4;
  undefined1 *__n1;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  cmValue cVar8;
  pointer pbVar9;
  string *obj;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string object;
  string local_a0;
  uint local_7c;
  string local_78;
  string *local_58;
  string local_50;
  
  pcVar1 = this->LocalGenerator;
  local_58 = variableNameExternal;
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"_OBJECTS","");
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_78,pcVar1,psVar6,&local_a0);
  std::__cxx11::string::operator=((string *)variableName,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = (this->BuildFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# Object files for target ",0x1a);
  psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar2,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(variableName->_M_dataplus)._M_p,variableName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," =",2);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  pcVar3 = this->GlobalGenerator;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"CMAKE_PCH_EXTENSION","");
  cVar8 = cmMakefile::GetDefinition(this_00,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pbVar9 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->Objects).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_7c = (uint)useWatcomQuote;
  do {
    if (pbVar9 == pbVar4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (this->BuildFileStream)._M_t.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                 .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"\n",1);
      pcVar1 = this->LocalGenerator;
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_EXTERNAL_OBJECTS","");
      cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_a0,pcVar1,psVar6,&local_50);
      std::__cxx11::string::operator=((string *)local_58,(string *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar2,"# External object files for target ",0x23);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)pcVar2,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(local_58->_M_dataplus)._M_p,local_58->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," =",2);
      pbVar9 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar9 != pbVar4) {
        do {
          cmOutputConverter::MaybeRelativeToCurBinDir
                    (&local_a0,
                     &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,pbVar9);
          std::__cxx11::string::operator=((string *)&local_78,(string *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          pcVar2 = (this->BuildFileStream)._M_t.
                   super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                   .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2," ",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pcVar2,(pcVar3->LineContinueDirective)._M_dataplus._M_p,
                     (pcVar3->LineContinueDirective)._M_string_length);
          pcVar2 = (this->BuildFileStream)._M_t.
                   super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                   .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
          cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath
                    (&local_a0,pbVar9,SUB41(local_7c,0));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pcVar2,local_a0._M_dataplus._M_p,local_a0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar4);
      }
      pcVar2 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
    local_a0._M_string_length = (size_type)(pbVar9->_M_dataplus)._M_p;
    local_a0._M_dataplus._M_p = (pointer)pbVar9->_M_string_length;
    if (cVar8.Value == (string *)0x0) {
LAB_0040fd04:
      pcVar2 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar2," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar2,(pcVar3->LineContinueDirective)._M_dataplus._M_p,
                 (pcVar3->LineContinueDirective)._M_string_length);
      pcVar2 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(&local_a0,pbVar9,SUB41(local_7c,0));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar2,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      __n1 = (undefined1 *)(cVar8.Value)->_M_string_length;
      if (local_a0._M_dataplus._M_p < __n1) goto LAB_0040fd04;
      __str._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
      __str._M_len = (size_t)__n1;
      iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_a0,
                         (long)local_a0._M_dataplus._M_p - (long)__n1,(size_type)__n1,__str);
      if (iVar5 != 0) goto LAB_0040fd04;
    }
    pbVar9 = pbVar9 + 1;
  } while( true );
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const auto& lineContinue = this->GlobalGenerator->LineContinueDirective;

  cmValue pchExtension = this->Makefile->GetDefinition("CMAKE_PCH_EXTENSION");

  for (std::string const& obj : this->Objects) {
    if (cmHasSuffix(obj, pchExtension)) {
      continue;
    }
    *this->BuildFileStream << " " << lineContinue;
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  for (std::string const& obj : this->ExternalObjects) {
    object = this->LocalGenerator->MaybeRelativeToCurBinDir(obj);
    *this->BuildFileStream << " " << lineContinue;
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}